

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITexec.cpp
# Opt level: O0

void pop_register(void)

{
  uint uVar1;
  uint re_adr;
  
  registe_ptr->R0 = r0;
  registe_ptr->R1 = r1;
  registe_ptr->R2 = r2;
  registe_ptr->R3 = r3;
  registe_ptr->R4 = r4;
  if (jit_type == '\x01') {
    uVar1 = *(uint *)(stack_ptr + registe_ptr->SP);
    registe_ptr->SP = registe_ptr->SP - 4;
    registe_ptr->IP = uVar1;
  }
  else if (jit_type == '\0') {
    registe_ptr->IP = code_bin_end + registe_ptr->CS;
  }
  return;
}

Assistant:

void pop_register() {
	registe_ptr->R0 = r0;
	registe_ptr->R1 = r1;
	registe_ptr->R2 = r2;
	registe_ptr->R3 = r3;
	registe_ptr->R4 = r4;
	if (jit_type == 1) {
		unsigned re_adr = *(unsigned*)(stack_ptr + registe_ptr->SP);
		registe_ptr->SP -= 4;
		registe_ptr->IP = re_adr;
	}
	else if (jit_type == 0) {
		registe_ptr->IP = code_bin_end + registe_ptr->CS;
	}
}